

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveLoadElf(Parser *parser,int flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  DirectiveLoadMipsElf *pDVar4;
  undefined4 in_register_00000034;
  vector<Expression,_std::allocator<Expression>_> list;
  StringLiteral inputName;
  StringLiteral outputName;
  vector<Expression,_std::allocator<Expression>_> local_b8;
  path local_a0;
  StringLiteral local_80;
  StringLiteral local_60;
  path local_40;
  
  local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&local_b8,1,2);
  if (!bVar3) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_00166cdc;
  }
  paVar1 = &local_80._value.field_2;
  local_80._value._M_string_length = 0;
  local_80._value.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_60._value.field_2;
  local_60._value._M_string_length = 0;
  local_60._value.field_2._M_local_buf[0] = '\0';
  local_80._value._M_dataplus._M_p = (pointer)paVar1;
  local_60._value._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = Expression::evaluateString
                    (local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_80,true);
  if (bVar3) {
    if ((long)local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      bVar3 = Expression::evaluateString
                        (local_b8.super__Vector_base<Expression,_std::allocator<Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1,&local_60,true);
      if (!bVar3) goto LAB_00166c6f;
      StringLiteral::path(&local_a0,&local_80);
      StringLiteral::path(&local_40,&local_60);
      pDVar4 = (DirectiveLoadMipsElf *)operator_new(0x68);
      DirectiveLoadMipsElf::DirectiveLoadMipsElf(pDVar4,&local_a0,&local_40);
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pDVar4;
      ghc::filesystem::path::~path(&local_40);
    }
    else {
      StringLiteral::path(&local_a0,&local_80);
      pDVar4 = (DirectiveLoadMipsElf *)operator_new(0x68);
      DirectiveLoadMipsElf::DirectiveLoadMipsElf(pDVar4,&local_a0);
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pDVar4;
    }
    ghc::filesystem::path::~path(&local_a0);
  }
  else {
LAB_00166c6f:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._value._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._value._M_dataplus._M_p,
                    CONCAT71(local_60._value.field_2._M_allocated_capacity._1_7_,
                             local_60._value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._value._M_dataplus._M_p,
                    CONCAT71(local_80._value.field_2._M_allocated_capacity._1_7_,
                             local_80._value.field_2._M_local_buf[0]) + 1);
  }
LAB_00166cdc:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_b8);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveLoadElf(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName, outputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;

	if (list.size() == 2)
	{
		if (!list[1].evaluateString(outputName,true))
			return nullptr;
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path(),outputName.path());
	} else {
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path());
	}
}